

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O1

bool __thiscall JumpBasic::foldInGuards(JumpBasic *this,Funcdata *fd,JumpTable *jump)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  pointer pGVar4;
  undefined8 *puVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  
  pGVar4 = (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
      super__Vector_impl_data._M_finish == pGVar4) {
    bVar7 = false;
  }
  else {
    lVar8 = 0;
    uVar6 = 0;
    bVar7 = false;
    do {
      lVar1 = *(long *)((long)&pGVar4->cbranch + lVar8);
      if (lVar1 != 0) {
        puVar5 = (undefined8 *)((long)&pGVar4->cbranch + lVar8);
        if ((*(byte *)(lVar1 + 8) & 0x20) == 0) {
          iVar2 = (*(this->super_JumpModel)._vptr_JumpModel[0xf])(this,fd,puVar5,jump);
          if ((char)iVar2 != '\0') {
            bVar7 = true;
          }
        }
        else {
          *puVar5 = 0;
        }
      }
      uVar6 = uVar6 + 1;
      pGVar4 = (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->selectguards).
                     super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pGVar4 >> 3) * -0x71c71c71c71c71c7;
      lVar8 = lVar8 + 0x48;
    } while (uVar6 <= uVar3 && uVar3 - uVar6 != 0);
  }
  return bVar7;
}

Assistant:

bool JumpBasic::foldInGuards(Funcdata *fd,JumpTable *jump)

{ // We now think of the BRANCHIND as encompassing
  // the guard function, so we "disarm" the guard
  // instructions by making the guard condition
  // always false.  If the simplification removes
  // the unusable branches, we are left with only
  // one path through the switch
  bool change = false;
  for(int4 i=0;i<selectguards.size();++i) {
    PcodeOp *cbranch = selectguards[i].getBranch();
    if (cbranch == (PcodeOp *)0) continue; // Already normalized
    if (cbranch->isDead()) {
      selectguards[i].clear();
      continue;
    }
    if (foldInOneGuard(fd,selectguards[i],jump))
      change = true;
  }
  return change;
}